

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_trie.hpp
# Opt level: O0

uint64_t __thiscall
poplar::
compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
::get_dsp_(compact_bonsai_trie<85U,_3U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
           *this,uint64_t slot_id)

{
  uint64_t uVar1;
  standard_hash_table<80U,_poplar::hash::vigna_hasher> *in_RSI;
  uint64_t in_RDI;
  uint64_t unaff_retaddr;
  uint64_t dsp;
  compact_vector *in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  uVar1 = compact_vector::operator[](in_stack_ffffffffffffffe0,in_RDI);
  local_8 = uVar1 & 7;
  if (6 < local_8) {
    uVar1 = compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>::get
                      ((compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher> *)dsp,
                       unaff_retaddr);
    if (uVar1 == 0xffffffffffffffff) {
      local_8 = standard_hash_table<80U,_poplar::hash::vigna_hasher>::get(in_RSI,0xffffffffffffffff)
      ;
    }
    else {
      local_8 = uVar1 + 7;
    }
  }
  return local_8;
}

Assistant:

uint64_t get_dsp_(uint64_t slot_id) const {
        uint64_t dsp = table_[slot_id] & dsp1_mask;
        if (dsp < dsp1_mask) {
            return dsp;
        }

        dsp = aux_cht_.get(slot_id);
        if (dsp != aux_cht_type::nil) {
            return dsp + dsp1_mask;
        }

        return aux_map_.get(slot_id);
    }